

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
pbrt::ParameterDictionary::
lookupArray<int,pstd::vector<double,pstd::pmr::polymorphic_allocator<double>>const&(*)(pbrt::ParsedParameter_const&),int(*)(double_const*,pbrt::FileLoc_const*)>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ParameterDictionary *this,
          string *name,ParameterType type,char *typeName,int nPerItem,
          _func_vector<double,_pstd::pmr::polymorphic_allocator<double>_>_ptr_ParsedParameter_ptr
          *getValues,_func_int_double_ptr_FileLoc_ptr *convert)

{
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  size_t sVar2;
  ParsedParameter *pPVar3;
  size_t __n;
  ulong uVar4;
  vector<int,_std::allocator<int>_> *pvVar5;
  int iVar6;
  vector<double,_pstd::pmr::polymorphic_allocator<double>_> *pvVar7;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  allocator_type local_55;
  int local_54;
  vector<int,_std::allocator<int>_> *local_50;
  char *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  int local_34;
  
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar2 = (this->params).nStored;
  paVar8 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar8 = paVar1;
  }
  bVar12 = sVar2 == 0;
  local_50 = __return_storage_ptr__;
  if (!bVar12) {
    lVar11 = 0;
    local_48 = typeName;
    local_34 = nPerItem;
    do {
      pPVar3 = *(ParsedParameter **)((long)paVar8 + lVar11);
      __n = (pPVar3->name)._M_string_length;
      if ((__n == name->_M_string_length) &&
         (((local_40 = &pPVar3->name, __n == 0 ||
           (iVar6 = bcmp((local_40->_M_dataplus)._M_p,(name->_M_dataplus)._M_p,__n), iVar6 == 0)) &&
          (iVar6 = std::__cxx11::string::compare((char *)pPVar3), iVar6 == 0)))) {
        pvVar7 = (*getValues)(pPVar3);
        pvVar5 = local_50;
        local_54 = local_34;
        uVar4 = pvVar7->nStored;
        if (uVar4 == 0) {
          ErrorExit<std::__cxx11::string_const&>
                    (&pPVar3->loc,"No values provided for \"%s\".",local_40);
        }
        uVar9 = (ulong)local_34;
        local_48 = (char *)uVar4;
        if (uVar4 % uVar9 != 0) {
          ErrorExit<std::__cxx11::string_const&,int&>
                    (&pPVar3->loc,"Number of values provided for \"%s\" not a multiple of %d",
                     local_40,&local_54);
        }
        pPVar3->lookedUp = true;
        std::vector<int,_std::allocator<int>_>::vector(local_50,uVar4 / uVar9,&local_55);
        if (uVar9 <= local_48) {
          uVar10 = 0;
          do {
            iVar6 = (*convert)(pvVar7->ptr + (long)local_54 * uVar10,&pPVar3->loc);
            (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start[uVar10] = iVar6;
            uVar10 = uVar10 + 1;
          } while (uVar10 < uVar4 / uVar9);
        }
        if (!bVar12) {
          return local_50;
        }
        break;
      }
      lVar11 = lVar11 + 8;
      bVar12 = sVar2 << 3 == lVar11;
    } while (!bVar12);
  }
  (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  return local_50;
}

Assistant:

std::vector<ReturnType> ParameterDictionary::lookupArray(const std::string &name,
                                                         ParameterType type,
                                                         const char *typeName,
                                                         int nPerItem, G getValues,
                                                         C convert) const {
    for (const ParsedParameter *p : params)
        if (p->name == name && p->type == typeName)
            return returnArray<ReturnType>(getValues(*p), *p, nPerItem, convert);

    return {};
}